

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nassa_e_contro.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  long *plVar5;
  reference __val;
  iterator pvVar6;
  iterator __last;
  short *psVar7;
  iterator pvVar8;
  iterator __last_00;
  short *psVar9;
  bool bIsPieno;
  bool bIsCavallo;
  short *estratto;
  iterator __end1;
  iterator __begin1;
  list<short,_std::allocator<short>_> *__range1;
  int local_2b8;
  int loss;
  int win;
  int balance;
  int maxperdita;
  allocator<char> local_2a1;
  int x;
  string sFilename;
  long local_270;
  ifstream inFile;
  undefined1 local_68 [8];
  list<short,_std::allocator<short>_> serie;
  array<short,_3UL> pieno;
  short sStack_42;
  array<short,_17UL> cavalli;
  char **argv_local;
  int argc_local;
  
  pieno._M_elems[0] = 0;
  pieno._M_elems[1] = 3;
  pieno._M_elems[2] = 0xc;
  sStack_42 = 0xf;
  serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size._4_2_ = 0x1a;
  serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size._0_4_ = 0x130002;
  std::__cxx11::list<short,_std::allocator<short>_>::list
            ((list<short,_std::allocator<short>_> *)local_68);
  std::ifstream::ifstream(&local_270);
  if (argc == 2) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&x,__s,&local_2a1);
    std::allocator<char>::~allocator(&local_2a1);
    std::ifstream::open(&local_270,&x,8);
    bVar1 = std::ios::operator!((ios *)((long)&local_270 + *(long *)(local_270 + -0x18)));
    if ((bVar1 & 1) != 0) {
      std::operator<<((ostream *)&std::cerr,"Unable to open file datafile.txt");
      exit(1);
    }
    while( true ) {
      plVar5 = (long *)std::istream::operator>>((istream *)&local_270,&maxperdita);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      balance._2_2_ = (undefined2)maxperdita;
      std::__cxx11::list<short,_std::allocator<short>_>::push_back
                ((list<short,_std::allocator<short>_> *)local_68,
                 (value_type_conflict *)((long)&balance + 2));
    }
    std::ifstream::close();
    loss = 0;
    local_2b8 = 0;
    __range1._4_4_ = 0;
    __end1 = std::__cxx11::list<short,_std::allocator<short>_>::begin
                       ((list<short,_std::allocator<short>_> *)local_68);
    estratto = (short *)std::__cxx11::list<short,_std::allocator<short>_>::end
                                  ((list<short,_std::allocator<short>_> *)local_68);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&estratto), bVar2) {
      __val = std::_List_iterator<short>::operator*(&__end1);
      pvVar6 = std::begin<std::array<short,17ul>>((array<short,_17UL> *)&pieno);
      __last = std::end<std::array<short,17ul>>((array<short,_17UL> *)&pieno);
      psVar7 = std::find<short*,short>(pvVar6,__last,__val);
      pvVar6 = std::end<std::array<short,17ul>>((array<short,_17UL> *)&pieno);
      pvVar8 = std::begin<std::array<short,3ul>>
                         ((array<short,_3UL> *)
                          &serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.
                           _M_size);
      __last_00 = std::end<std::array<short,3ul>>
                            ((array<short,_3UL> *)
                             &serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.
                              _M_size);
      psVar9 = std::find<short*,short>(pvVar8,__last_00,__val);
      pvVar8 = std::end<std::array<short,3ul>>
                         ((array<short,_3UL> *)
                          &serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.
                           _M_size);
      if (psVar9 == pvVar8) {
        if (psVar7 == pvVar6) {
          loss = loss + -100;
          __range1._4_4_ = __range1._4_4_ + 1;
        }
        else {
          loss = loss + 0x46;
          local_2b8 = local_2b8 + 1;
        }
      }
      else {
        loss = loss + 0xfa;
        local_2b8 = local_2b8 + 1;
      }
      std::_List_iterator<short>::operator++(&__end1);
    }
    std::operator<<((ostream *)&std::cout,(string *)&x);
    poVar4 = std::operator<<((ostream *)&std::cout," Win:");
    _Var3 = std::setw(5);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2b8);
    poVar4 = std::operator<<(poVar4," Loss:");
    _Var3 = std::setw(5);
    poVar4 = std::operator<<(poVar4,_Var3);
    std::ostream::operator<<(poVar4,__range1._4_4_);
    _Var3 = std::setw(5);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar4 = std::operator<<(poVar4," Balance:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,loss);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
    sFilename.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&x);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"example: roulette serie.txt");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    sFilename.field_2._8_4_ = 1;
  }
  std::ifstream::~ifstream(&local_270);
  std::__cxx11::list<short,_std::allocator<short>_>::~list
            ((list<short,_std::allocator<short>_> *)local_68);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    // your code goes here
    //nassa = 0/3-12/15-19-26-32/35
    //contro nassa = 2-4/7-18/21-22/25-28/29 

    std::array<short, 17> cavalli{{0,3,12,15,32,35,4,7,18,21,22,25,28,29}};
    std::array<short, 3> pieno{{2,19,26}};
    std::list<short> serie;
    ifstream inFile;
    if (argc!=2)
    {
        std::cerr<<"example: roulette serie.txt"<<std::endl;
        return -1;
    }

    std::string sFilename(argv[1]);
    inFile.open(sFilename);
    if (!inFile)
    {
        std::cerr << "Unable to open file datafile.txt";
        exit(1); // call system to stop
    }
    int x;
    while (inFile >> x)
    {
        //std::cout<<x<<std::endl;
        serie.push_back(x);
    }
    inFile.close();

    int maxperdita;
    int balance=0;
    int win=0;
    int loss=0;
    for (short &estratto : serie)
    {
        
        bool bIsCavallo = std::find(std::begin(cavalli), std::end(cavalli), estratto) != std::end(cavalli);
        bool bIsPieno = std::find(std::begin(pieno), std::end(pieno), estratto) != std::end(pieno);

        if (bIsPieno)
        {
            balance+=250;
            win++;
        }
        else if (bIsCavallo) 
        {
            balance+=70;
            win++;
        }
        else
        { 
            balance-=100;
            loss++;
        }
    }
    std::cout << sFilename;
    std::cout << " Win:" << std::setw(5)<<win<< " Loss:" <<std::setw(5)<< loss;
    std::cout <<std::setw(5)<< " Balance:" << balance << std::endl;
    return 0;
}